

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexture.cpp
# Opt level: O1

void __thiscall
QOpenGLTexture::generateMipMaps(QOpenGLTexture *this,int baseLevel,bool resetBaseLevel)

{
  QOpenGLTexturePrivate *pQVar1;
  QOpenGLTextureHelper *pQVar2;
  bool bVar3;
  char cVar4;
  long lVar5;
  code *pcVar6;
  long *plVar7;
  int baseLevel_00;
  
  pQVar1 = (this->d_ptr).d;
  bVar3 = isCompressedFormat(pQVar1->format);
  if (((bVar3) && (lVar5 = QOpenGLContext::currentContext(), lVar5 != 0)) &&
     (cVar4 = QOpenGLContext::isOpenGLES(), cVar4 != '\0')) {
    return;
  }
  baseLevel_00 = -0x55555556;
  if (resetBaseLevel) {
    baseLevel_00 = ((this->d_ptr).d)->baseLevel;
  }
  setMipBaseLevel(this,baseLevel);
  pQVar2 = pQVar1->texFuncs;
  pcVar6 = (code *)pQVar2->GenerateTextureMipmap;
  plVar7 = (long *)((long)&pQVar2->functions + *(long *)&pQVar2->field_0x50);
  if (((ulong)pcVar6 & 1) != 0) {
    pcVar6 = *(code **)(pcVar6 + *plVar7 + -1);
  }
  (*pcVar6)(plVar7,pQVar1->textureId,pQVar1->target,pQVar1->bindingTarget);
  if (!resetBaseLevel) {
    return;
  }
  setMipBaseLevel(this,baseLevel_00);
  return;
}

Assistant:

void QOpenGLTexture::generateMipMaps(int baseLevel, bool resetBaseLevel)
{
    Q_D(QOpenGLTexture);
    Q_ASSERT(d->texFuncs);
    Q_ASSERT(d->textureId);
    if (isCompressedFormat(d->format)) {
        if (QOpenGLContext *ctx = QOpenGLContext::currentContext())
            if (ctx->isOpenGLES())
                return;
    }
    int oldBaseLevel;
    if (resetBaseLevel)
        oldBaseLevel = mipBaseLevel();
    setMipBaseLevel(baseLevel);
    d->texFuncs->glGenerateTextureMipmap(d->textureId, d->target, d->bindingTarget);
    if (resetBaseLevel)
        setMipBaseLevel(oldBaseLevel);
}